

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

string * CLI::AsNumberWithUnit::generate_description<double>
                   (string *__return_storage_ptr__,string *name,Options opts)

{
  ostream *poVar1;
  stringstream out;
  char local_1a9;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_198,"FLOAT",5);
  local_1a9 = ' ';
  ::std::__ostream_insert<char,std::char_traits<char>>(local_198,&local_1a9,1);
  if ((opts & UNIT_REQUIRED) == CASE_SENSITIVE) {
    local_1a9 = '[';
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>(local_198,&local_1a9,1);
    poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
    local_1a9 = ']';
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1a9,1);
  }
  else {
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_198,(name->_M_dataplus)._M_p,name->_M_string_length);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  ::std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static std::string generate_description(const std::string &name, Options opts) {
        std::stringstream out;
        out << detail::type_name<Number>() << ' ';
        if(opts & UNIT_REQUIRED) {
            out << name;
        } else {
            out << '[' << name << ']';
        }
        return out.str();
    }